

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

Symbol * elf_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  int iVar1;
  Symbol *pSVar2;
  long in_RDX;
  long in_RDI;
  int i;
  GlobalVars *unaff_retaddr;
  uint local_24;
  undefined8 in_stack_fffffffffffffff8;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    for (local_24 = 0; local_24 < 7; local_24 = local_24 + 1) {
      iVar1 = strcmp(elf_symnames[(int)local_24],*(char **)(in_RDX + 0x10));
      if (iVar1 == 0) {
        pSVar2 = elf_makelnksym(unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20));
        return pSVar2;
      }
    }
  }
  return (Symbol *)0x0;
}

Assistant:

struct Symbol *elf_lnksym(struct GlobalVars *gv,struct Section *sec,
                          struct Reloc *xref)
/* Check for common ELF linker symbols. */
{
  int i;

  if (!gv->dest_object) {
    for (i=0; i<(sizeof(elf_symnames)/sizeof(elf_symnames[0])); i++) {
      if (!strcmp(elf_symnames[i],xref->xrefname))
        return elf_makelnksym(gv,i);  /* new linker symbol created */
    }
  }
  return NULL;
}